

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scope.cpp
# Opt level: O1

void __thiscall
slang::ast::Scope::handleExportedMethods
          (Scope *this,span<slang::ast::Symbol_*const,_18446744073709551615UL> deferredMembers)

{
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar1;
  char *pcVar2;
  short sVar3;
  int *piVar4;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> pSVar5;
  ModportSubroutinePortSyntax *syntax;
  long lVar6;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar7;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar8;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar9;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> hVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  size_t sVar15;
  char *pcVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar21;
  uint64_t uVar22;
  MethodPrototypeSymbol *pMVar23;
  uint uVar24;
  uint uVar25;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar26;
  ulong uVar27;
  byte *pbVar28;
  pointer ppSVar29;
  long lVar30;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *phVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  size_t *psVar35;
  bool bVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  try_emplace_args_t local_289;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *local_288;
  string_view name;
  value_type *elements_1;
  value_type *elements_2;
  value_type *elements;
  locator res;
  size_t *local_1d8;
  long local_1d0;
  long local_1c0;
  size_t *local_1b8;
  size_t *local_1b0;
  ModportSubroutinePortSyntax *local_1a8;
  pointer local_1a0;
  pointer local_198;
  int *local_190;
  ulong local_188;
  ulong local_180;
  SyntaxNode *local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_4UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  waitingForImport;
  SmallMap<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*,_4UL,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>_>
  foundImports;
  
  ppSVar29 = deferredMembers._M_ptr;
  waitingForImport.super_Storage.ptr = (char *)&waitingForImport;
  waitingForImport._80_8_ = 0x3f;
  waitingForImport._88_8_ = 1;
  waitingForImport._96_16_ = ZEXT816(0x4b62e0);
  waitingForImport._112_8_ = 0;
  foundImports.super_Storage.ptr = (char *)&foundImports;
  foundImports._112_8_ = 0x3f;
  foundImports._120_8_ = 1;
  foundImports._128_8_ =
       boost::unordered::detail::foa::
       dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
       ::storage;
  foundImports._136_8_ = 0;
  foundImports._144_8_ = 0;
  waitingForImport._120_8_ = 0;
  foundImports._152_8_ = 0;
  waitingForImport.super_Storage._72_8_ = waitingForImport.super_Storage.ptr;
  foundImports.super_Storage._104_8_ = foundImports.super_Storage.ptr;
  if (deferredMembers._M_extent._M_extent_value._M_extent_value != 0) {
    local_1a0 = ppSVar29 + deferredMembers._M_extent._M_extent_value._M_extent_value;
    do {
      piVar4 = *(int **)(*ppSVar29 + 1);
      local_198 = ppSVar29;
      if ((*piVar4 == 0x12d) && (1 < *(long *)(piVar4 + 0x24) + 1U)) {
        uVar32 = *(long *)(piVar4 + 0x24) + 1U >> 1;
        uVar33 = 0;
        local_190 = piVar4;
        local_188 = uVar32;
        do {
          ppSVar21 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                               ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *
                                )(uVar33 * 0x30 + *(long *)(local_190 + 0x22)));
          local_178 = (*ppSVar21)[1].previewNode;
          pbVar28 = (byte *)((long)&(local_178[3].previewNode)->kind + 1);
          if ((byte *)0x1 < pbVar28) {
            uVar27 = 0;
            local_180 = uVar33;
            do {
              ppSVar21 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)(local_178[3].parent + uVar27 * 2));
              pSVar5 = *ppSVar21;
              local_168 = uVar27;
              if ((pSVar5->kind == ModportSubroutinePortList) && (1 < *(long *)(pSVar5 + 6) + 1U)) {
                sVar3 = *(short *)&pSVar5[3].parent;
                local_160 = *(long *)(pSVar5 + 6) + 1U >> 1;
                uVar32 = 0;
                do {
                  ppSVar21 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                         *)(pSVar5[5].previewNode + uVar32 * 2));
                  syntax = (ModportSubroutinePortSyntax *)*ppSVar21;
                  if ((syntax->super_ModportPortSyntax).super_SyntaxNode.kind == ModportNamedPort) {
                    if ((sVar3 == 0xa5) &&
                       (name = parsing::Token::valueText((Token *)&syntax->prototype),
                       name._M_len != 0)) {
                      phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )this->nameMap;
                      uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()(phVar26,&name);
                      uVar27 = uVar22 >> ((byte)*phVar26 & 0x3f);
                      phVar31 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                  **)(phVar26 + 0x10);
                      lVar30 = (uVar22 & 0xff) * 4;
                      hVar7 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                               (&UNK_004b638c + lVar30);
                      hVar8 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                               (&UNK_004b638d + lVar30);
                      hVar9 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                               (&UNK_004b638e + lVar30);
                      hVar10 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )(&UNK_004b638f + lVar30);
                      sVar15 = name._M_len;
                      pcVar16 = name._M_str;
                      uVar33 = 0;
                      do {
                        phVar1 = phVar31 + uVar27 * 0x10;
                        auVar37[0] = -(*phVar1 == hVar7);
                        auVar37[1] = -(phVar1[1] == hVar8);
                        auVar37[2] = -(phVar1[2] == hVar9);
                        auVar37[3] = -(phVar1[3] == hVar10);
                        auVar37[4] = -(phVar1[4] == hVar7);
                        auVar37[5] = -(phVar1[5] == hVar8);
                        auVar37[6] = -(phVar1[6] == hVar9);
                        auVar37[7] = -(phVar1[7] == hVar10);
                        auVar37[8] = -(phVar1[8] == hVar7);
                        auVar37[9] = -(phVar1[9] == hVar8);
                        auVar37[10] = -(phVar1[10] == hVar9);
                        auVar37[0xb] = -(phVar1[0xb] == hVar10);
                        auVar37[0xc] = -(phVar1[0xc] == hVar7);
                        auVar37[0xd] = -(phVar1[0xd] == hVar8);
                        auVar37[0xe] = -(phVar1[0xe] == hVar9);
                        auVar37[0xf] = -(phVar1[0xf] == hVar10);
                        uVar24 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
                        if (uVar24 != 0) {
                          lVar30 = *(long *)(phVar26 + 0x18);
                          local_288 = phVar31;
                          do {
                            uVar25 = 0;
                            if (uVar24 != 0) {
                              for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                              }
                            }
                            local_1b8 = (size_t *)(lVar30 + uVar27 * 0x168 + (ulong)uVar25 * 0x18);
                            bVar36 = sVar15 == *local_1b8;
                            if (bVar36 && sVar15 != 0) {
                              iVar20 = bcmp(pcVar16,(void *)local_1b8[1],sVar15);
                              bVar36 = iVar20 == 0;
                            }
                            if (bVar36) goto LAB_00342020;
                            uVar24 = uVar24 - 1 & uVar24;
                            phVar31 = local_288;
                          } while (uVar24 != 0);
                        }
                        if (((byte)phVar31[uVar27 * 0x10 + 0xf] &
                            (&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0)
                        break;
                        lVar30 = uVar27 + uVar33;
                        uVar33 = uVar33 + 1;
                        uVar27 = lVar30 + 1U & *(ulong *)(phVar26 + 8);
                      } while (uVar33 <= *(ulong *)(phVar26 + 8));
                      local_1b8 = (size_t *)0x0;
LAB_00342020:
                      if (local_1b8 == (size_t *)0x0) {
                        uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                                 operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                             *)&foundImports.super_Storage.field_0x68,&name);
                        uVar18 = foundImports._136_8_;
                        uVar17 = foundImports._120_8_;
                        uVar33 = uVar22 >> (foundImports._112_1_ & 0x3f);
                        lVar30 = (uVar22 & 0xff) * 4;
                        hVar7 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                  *)(&UNK_004b638c + lVar30);
                        hVar8 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                  *)(&UNK_004b638d + lVar30);
                        hVar9 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                  *)(&UNK_004b638e + lVar30);
                        hVar10 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)(&UNK_004b638f + lVar30);
                        sVar15 = name._M_len;
                        pcVar16 = name._M_str;
                        uVar27 = 0;
                        phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)foundImports._128_8_;
                        do {
                          phVar31 = phVar26 + uVar33 * 0x10;
                          auVar39[0] = -(*phVar31 == hVar7);
                          auVar39[1] = -(phVar31[1] == hVar8);
                          auVar39[2] = -(phVar31[2] == hVar9);
                          auVar39[3] = -(phVar31[3] == hVar10);
                          auVar39[4] = -(phVar31[4] == hVar7);
                          auVar39[5] = -(phVar31[5] == hVar8);
                          auVar39[6] = -(phVar31[6] == hVar9);
                          auVar39[7] = -(phVar31[7] == hVar10);
                          auVar39[8] = -(phVar31[8] == hVar7);
                          auVar39[9] = -(phVar31[9] == hVar8);
                          auVar39[10] = -(phVar31[10] == hVar9);
                          auVar39[0xb] = -(phVar31[0xb] == hVar10);
                          auVar39[0xc] = -(phVar31[0xc] == hVar7);
                          auVar39[0xd] = -(phVar31[0xd] == hVar8);
                          auVar39[0xe] = -(phVar31[0xe] == hVar9);
                          auVar39[0xf] = -(phVar31[0xf] == hVar10);
                          uVar24 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                                  (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                                  (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                                  (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                                  (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                                  (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                                  (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                                  (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                                  (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                                  (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                                  (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                                  (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                                  (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                                  (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                                 (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
                          if (uVar24 != 0) {
                            local_288 = phVar26;
                            do {
                              uVar25 = 0;
                              if (uVar24 != 0) {
                                for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                                }
                              }
                              psVar35 = (size_t *)((ulong)uVar25 * 0x18 + uVar18 + uVar33 * 0x168);
                              bVar36 = sVar15 == *psVar35;
                              if (bVar36 && sVar15 != 0) {
                                iVar20 = bcmp(pcVar16,(void *)psVar35[1],sVar15);
                                bVar36 = iVar20 == 0;
                              }
                              if (bVar36) goto LAB_0034239b;
                              uVar24 = uVar24 - 1 & uVar24;
                              phVar26 = local_288;
                            } while (uVar24 != 0);
                          }
                          if (((byte)phVar26[uVar33 * 0x10 + 0xf] &
                              (&boost::unordered::detail::foa::
                                group15<boost::unordered::detail::foa::plain_integral>::
                                is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0)
                          break;
                          lVar30 = uVar33 + uVar27;
                          uVar27 = uVar27 + 1;
                          uVar33 = lVar30 + 1U & uVar17;
                        } while (uVar27 <= (ulong)uVar17);
                        psVar35 = (size_t *)0x0;
LAB_0034239b:
                        if (psVar35 == (size_t *)0x0) {
                          local_288 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                         ::operator()((
                                                  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                                  *)&waitingForImport.super_Storage.field_0x48,&name
                                                  );
                          uVar17 = waitingForImport._88_8_;
                          uVar27 = (ulong)local_288 >> (waitingForImport._80_1_ & 0x3f);
                          uVar18 = waitingForImport._96_8_;
                          lVar30 = ((ulong)local_288 & 0xff) * 4;
                          cVar11 = (&UNK_004b638c)[lVar30];
                          cVar12 = (&UNK_004b638d)[lVar30];
                          cVar13 = (&UNK_004b638e)[lVar30];
                          cVar14 = (&UNK_004b638f)[lVar30];
                          uVar19 = waitingForImport._104_8_;
                          sVar15 = name._M_len;
                          pcVar16 = name._M_str;
                          uVar24 = (uint)local_288;
                          uVar34 = 0;
                          uVar33 = uVar27;
                          do {
                            pcVar2 = (char *)(uVar18 + uVar33 * 0x10);
                            auVar41[0] = -(*pcVar2 == cVar11);
                            auVar41[1] = -(pcVar2[1] == cVar12);
                            auVar41[2] = -(pcVar2[2] == cVar13);
                            auVar41[3] = -(pcVar2[3] == cVar14);
                            auVar41[4] = -(pcVar2[4] == cVar11);
                            auVar41[5] = -(pcVar2[5] == cVar12);
                            auVar41[6] = -(pcVar2[6] == cVar13);
                            auVar41[7] = -(pcVar2[7] == cVar14);
                            auVar41[8] = -(pcVar2[8] == cVar11);
                            auVar41[9] = -(pcVar2[9] == cVar12);
                            auVar41[10] = -(pcVar2[10] == cVar13);
                            auVar41[0xb] = -(pcVar2[0xb] == cVar14);
                            auVar41[0xc] = -(pcVar2[0xc] == cVar11);
                            auVar41[0xd] = -(pcVar2[0xd] == cVar12);
                            auVar41[0xe] = -(pcVar2[0xe] == cVar13);
                            auVar41[0xf] = -(pcVar2[0xf] == cVar14);
                            uVar25 = (uint)(ushort)((ushort)(SUB161(auVar41 >> 7,0) & 1) |
                                                    (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                                                    (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                                                    (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                                                    (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                                                    (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                                                    (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                                                    (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                                                    (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                                                    (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                                                    (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                                                    (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                                                    (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                                                    (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                                                   (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe);
                            if (uVar25 != 0) {
                              lVar30 = uVar19 + uVar33 * 0xf0;
                              do {
                                iVar20 = 0;
                                if (uVar25 != 0) {
                                  for (; (uVar25 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
                                  }
                                }
                                bVar36 = sVar15 == *(size_t *)(lVar30 + (ulong)(uint)(iVar20 << 4));
                                local_1d0 = lVar30 + (ulong)(uint)(iVar20 << 4);
                                if (bVar36 && sVar15 != 0) {
                                  iVar20 = bcmp(pcVar16,*(void **)(local_1d0 + 8),sVar15);
                                  bVar36 = iVar20 == 0;
                                }
                                if (bVar36) goto LAB_0034278b;
                                uVar25 = uVar25 - 1 & uVar25;
                              } while (uVar25 != 0);
                            }
                            if ((*(byte *)(uVar33 * 0x10 + uVar18 + 0xf) &
                                (&boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::
                                  is_not_overflowed(unsigned_long)::shift)[uVar24 & 7]) == 0) break;
                            lVar30 = uVar33 + uVar34;
                            uVar34 = uVar34 + 1;
                            uVar33 = lVar30 + 1U & uVar17;
                          } while (uVar34 <= (ulong)uVar17);
                          local_1d0 = 0;
LAB_0034278b:
                          if (local_1d0 == 0) {
                            if ((ulong)waitingForImport._120_8_ < (ulong)waitingForImport._112_8_) {
                              boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                              ::
                              nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                                        (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                               *)&waitingForImport.super_Storage.field_0x48,
                                         (arrays_type *)&waitingForImport.field_0x50,uVar27,
                                         (size_t)local_288,&name);
                              waitingForImport._120_8_ = waitingForImport._120_8_ + 1;
                            }
                            else {
                              boost::unordered::detail::foa::
                              table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                              ::
                              unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                                        (&res,(table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::basic_string_view<char,std::char_traits<char>>,64ul,16ul>>
                                               *)&waitingForImport.super_Storage.field_0x48,
                                         (size_t)local_288,&name);
                            }
                          }
                        }
                        else {
                          pMVar23 = MethodPrototypeSymbol::implicitExtern
                                              (this,(ModportSubroutinePortSyntax *)psVar35[2]);
                          insertMember(this,&pMVar23->super_Symbol,(Symbol *)0x0,true,true);
                        }
                      }
                    }
                  }
                  else {
                    res._0_16_ = slang::syntax::SyntaxNode::getLastToken
                                           ((SyntaxNode *)(((syntax->prototype).ptr)->name).ptr);
                    name = parsing::Token::valueText((Token *)&res);
                    if (name._M_len != 0) {
                      phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )this->nameMap;
                      uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                               operator()(phVar26,&name);
                      uVar33 = uVar22 >> ((byte)*phVar26 & 0x3f);
                      lVar6 = *(long *)(phVar26 + 0x10);
                      lVar30 = (uVar22 & 0xff) * 4;
                      cVar11 = (&UNK_004b638c)[lVar30];
                      cVar12 = (&UNK_004b638d)[lVar30];
                      cVar13 = (&UNK_004b638e)[lVar30];
                      cVar14 = (&UNK_004b638f)[lVar30];
                      sVar15 = name._M_len;
                      pcVar16 = name._M_str;
                      uVar27 = 0;
                      local_288 = phVar26;
                      do {
                        pcVar2 = (char *)(lVar6 + uVar33 * 0x10);
                        auVar38[0] = -(*pcVar2 == cVar11);
                        auVar38[1] = -(pcVar2[1] == cVar12);
                        auVar38[2] = -(pcVar2[2] == cVar13);
                        auVar38[3] = -(pcVar2[3] == cVar14);
                        auVar38[4] = -(pcVar2[4] == cVar11);
                        auVar38[5] = -(pcVar2[5] == cVar12);
                        auVar38[6] = -(pcVar2[6] == cVar13);
                        auVar38[7] = -(pcVar2[7] == cVar14);
                        auVar38[8] = -(pcVar2[8] == cVar11);
                        auVar38[9] = -(pcVar2[9] == cVar12);
                        auVar38[10] = -(pcVar2[10] == cVar13);
                        auVar38[0xb] = -(pcVar2[0xb] == cVar14);
                        auVar38[0xc] = -(pcVar2[0xc] == cVar11);
                        auVar38[0xd] = -(pcVar2[0xd] == cVar12);
                        auVar38[0xe] = -(pcVar2[0xe] == cVar13);
                        auVar38[0xf] = -(pcVar2[0xf] == cVar14);
                        uVar24 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                                (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                                (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                                (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                                (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                                (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                                (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                                (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                                (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                                (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                                (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                                (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                                (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                                (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                                               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
                        if (uVar24 != 0) {
                          lVar30 = *(long *)(local_288 + 0x18);
                          local_170 = uVar32;
                          do {
                            uVar25 = 0;
                            if (uVar24 != 0) {
                              for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                              }
                            }
                            local_1b0 = (size_t *)(lVar30 + uVar33 * 0x168 + (ulong)uVar25 * 0x18);
                            bVar36 = sVar15 == *local_1b0;
                            if (bVar36 && sVar15 != 0) {
                              iVar20 = bcmp(pcVar16,(void *)local_1b0[1],sVar15);
                              bVar36 = iVar20 == 0;
                              uVar32 = local_170;
                            }
                            if (bVar36) goto LAB_00341fc6;
                            uVar24 = uVar24 - 1 & uVar24;
                          } while (uVar24 != 0);
                        }
                        if ((*(byte *)(uVar33 * 0x10 + lVar6 + 0xf) &
                            (&boost::unordered::detail::foa::
                              group15<boost::unordered::detail::foa::plain_integral>::
                              is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0)
                        break;
                        lVar30 = uVar33 + uVar27;
                        uVar27 = uVar27 + 1;
                        uVar33 = lVar30 + 1U & *(ulong *)(local_288 + 8);
                      } while (uVar27 <= *(ulong *)(local_288 + 8));
                      local_1b0 = (size_t *)0x0;
LAB_00341fc6:
                      if (local_1b0 == (size_t *)0x0) {
                        if (sVar3 == 0xa5) {
                          pMVar23 = MethodPrototypeSymbol::implicitExtern(this,syntax);
                          insertMember(this,&pMVar23->super_Symbol,(Symbol *)0x0,true,true);
                        }
                        else {
                          uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   ::operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                                 *)&waitingForImport.super_Storage.field_0x48,&name)
                          ;
                          uVar17 = waitingForImport._88_8_;
                          uVar33 = uVar22 >> (waitingForImport._80_1_ & 0x3f);
                          lVar30 = (uVar22 & 0xff) * 4;
                          hVar7 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)(&UNK_004b638c + lVar30);
                          hVar8 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)(&UNK_004b638d + lVar30);
                          hVar9 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                    *)(&UNK_004b638e + lVar30);
                          hVar10 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     *)(&UNK_004b638f + lVar30);
                          uVar18 = waitingForImport._104_8_;
                          sVar15 = name._M_len;
                          pcVar16 = name._M_str;
                          uVar27 = 0;
                          local_288 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)waitingForImport._96_8_;
                          do {
                            phVar26 = local_288 + uVar33 * 0x10;
                            auVar40[0] = -(*phVar26 == hVar7);
                            auVar40[1] = -(phVar26[1] == hVar8);
                            auVar40[2] = -(phVar26[2] == hVar9);
                            auVar40[3] = -(phVar26[3] == hVar10);
                            auVar40[4] = -(phVar26[4] == hVar7);
                            auVar40[5] = -(phVar26[5] == hVar8);
                            auVar40[6] = -(phVar26[6] == hVar9);
                            auVar40[7] = -(phVar26[7] == hVar10);
                            auVar40[8] = -(phVar26[8] == hVar7);
                            auVar40[9] = -(phVar26[9] == hVar8);
                            auVar40[10] = -(phVar26[10] == hVar9);
                            auVar40[0xb] = -(phVar26[0xb] == hVar10);
                            auVar40[0xc] = -(phVar26[0xc] == hVar7);
                            auVar40[0xd] = -(phVar26[0xd] == hVar8);
                            auVar40[0xe] = -(phVar26[0xe] == hVar9);
                            auVar40[0xf] = -(phVar26[0xf] == hVar10);
                            uVar24 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                                    (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                                    (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                                    (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                                    (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                                    (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                                    (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                                    (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                                    (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                                    (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                                    (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                                    (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                                    (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                                    (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                                   (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
                            if (uVar24 != 0) {
                              lVar30 = uVar18 + uVar33 * 0xf0;
                              do {
                                iVar20 = 0;
                                if (uVar24 != 0) {
                                  for (; (uVar24 >> iVar20 & 1) == 0; iVar20 = iVar20 + 1) {
                                  }
                                }
                                bVar36 = sVar15 == *(size_t *)(lVar30 + (ulong)(uint)(iVar20 << 4));
                                local_1c0 = lVar30 + (ulong)(uint)(iVar20 << 4);
                                if (bVar36 && sVar15 != 0) {
                                  iVar20 = bcmp(pcVar16,*(void **)(local_1c0 + 8),sVar15);
                                  bVar36 = iVar20 == 0;
                                }
                                if (bVar36) goto LAB_003423e0;
                                uVar24 = uVar24 - 1 & uVar24;
                              } while (uVar24 != 0);
                            }
                            if (((byte)local_288[uVar33 * 0x10 + 0xf] &
                                (&boost::unordered::detail::foa::
                                  group15<boost::unordered::detail::foa::plain_integral>::
                                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0)
                            break;
                            lVar30 = uVar33 + uVar27;
                            uVar27 = uVar27 + 1;
                            uVar33 = lVar30 + 1U & uVar17;
                          } while (uVar27 <= (ulong)uVar17);
                          local_1c0 = 0;
LAB_003423e0:
                          if (local_1c0 == 0) {
                            local_1a8 = syntax;
                            uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                     ::operator()((
                                                  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                                  *)&foundImports.super_Storage.field_0x68,&name);
                            uVar18 = foundImports._136_8_;
                            uVar17 = foundImports._120_8_;
                            uVar27 = uVar22 >> (foundImports._112_1_ & 0x3f);
                            lVar30 = (uVar22 & 0xff) * 4;
                            hVar7 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)(&UNK_004b638c + lVar30);
                            hVar8 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)(&UNK_004b638d + lVar30);
                            hVar9 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                      *)(&UNK_004b638e + lVar30);
                            hVar10 = *(hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)(&UNK_004b638f + lVar30);
                            sVar15 = name._M_len;
                            pcVar16 = name._M_str;
                            uVar34 = 0;
                            phVar26 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                       *)foundImports._128_8_;
                            uVar33 = uVar27;
                            do {
                              phVar31 = phVar26 + uVar33 * 0x10;
                              auVar42[0] = -(*phVar31 == hVar7);
                              auVar42[1] = -(phVar31[1] == hVar8);
                              auVar42[2] = -(phVar31[2] == hVar9);
                              auVar42[3] = -(phVar31[3] == hVar10);
                              auVar42[4] = -(phVar31[4] == hVar7);
                              auVar42[5] = -(phVar31[5] == hVar8);
                              auVar42[6] = -(phVar31[6] == hVar9);
                              auVar42[7] = -(phVar31[7] == hVar10);
                              auVar42[8] = -(phVar31[8] == hVar7);
                              auVar42[9] = -(phVar31[9] == hVar8);
                              auVar42[10] = -(phVar31[10] == hVar9);
                              auVar42[0xb] = -(phVar31[0xb] == hVar10);
                              auVar42[0xc] = -(phVar31[0xc] == hVar7);
                              auVar42[0xd] = -(phVar31[0xd] == hVar8);
                              auVar42[0xe] = -(phVar31[0xe] == hVar9);
                              auVar42[0xf] = -(phVar31[0xf] == hVar10);
                              uVar24 = (uint)(ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                                                      (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                                                      (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                                                      (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                                                      (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                                                      (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                                                      (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                                                      (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                                                      (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                                                      (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                                                      (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10
                                                      | (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) <<
                                                        0xb | (ushort)(SUB161(auVar42 >> 0x67,0) & 1
                                                                      ) << 0xc |
                                                      (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd
                                                     | (ushort)(SUB161(auVar42 >> 0x77,0) & 1) <<
                                                       0xe);
                              if (uVar24 != 0) {
                                local_288 = phVar26;
                                do {
                                  uVar25 = 0;
                                  if (uVar24 != 0) {
                                    for (; (uVar24 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                                    }
                                  }
                                  local_1d8 = (size_t *)
                                              ((ulong)uVar25 * 0x18 + uVar18 + uVar33 * 0x168);
                                  bVar36 = sVar15 == *local_1d8;
                                  if (bVar36 && sVar15 != 0) {
                                    iVar20 = bcmp(pcVar16,(void *)local_1d8[1],sVar15);
                                    bVar36 = iVar20 == 0;
                                  }
                                  if (bVar36) goto LAB_003427fe;
                                  uVar24 = uVar24 - 1 & uVar24;
                                  phVar26 = local_288;
                                } while (uVar24 != 0);
                              }
                              if (((byte)phVar26[uVar33 * 0x10 + 0xf] &
                                  (&boost::unordered::detail::foa::
                                    group15<boost::unordered::detail::foa::plain_integral>::
                                    is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7]) == 0
                                 ) break;
                              lVar30 = uVar33 + uVar34;
                              uVar34 = uVar34 + 1;
                              uVar33 = lVar30 + 1U & uVar17;
                            } while (uVar34 <= (ulong)uVar17);
                            local_1d8 = (size_t *)0x0;
LAB_003427fe:
                            if (local_1d8 == (size_t *)0x0) {
                              if ((ulong)foundImports._152_8_ < (ulong)foundImports._144_8_) {
                                boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                ::
                                nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                          ((locator *)&res,
                                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                            *)&foundImports.super_Storage.field_0x68,
                                           (arrays_type *)&foundImports.field_0x70,uVar27,uVar22,
                                           &local_289,&name,&local_1a8);
                                foundImports._152_8_ = foundImports._152_8_ + 1;
                              }
                              else {
                                boost::unordered::detail::foa::
                                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                ::
                                unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::syntax::ModportSubroutinePortSyntax*>
                                          ((locator *)&res,
                                           (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::syntax::ModportSubroutinePortSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::syntax::ModportSubroutinePortSyntax_const*>,96ul,16ul>>
                                            *)&foundImports.super_Storage.field_0x68,uVar22,
                                           &local_289,&name,&local_1a8);
                              }
                            }
                          }
                          else {
                            pMVar23 = MethodPrototypeSymbol::implicitExtern(this,syntax);
                            insertMember(this,&pMVar23->super_Symbol,(Symbol *)0x0,true,true);
                          }
                        }
                      }
                    }
                  }
                  uVar32 = uVar32 + 1;
                } while (uVar32 != local_160);
              }
              uVar27 = local_168 + 1;
              uVar32 = local_188;
              uVar33 = local_180;
            } while (uVar27 != (ulong)pbVar28 >> 1);
          }
          uVar33 = uVar33 + 1;
        } while (uVar33 != uVar32);
      }
      ppSVar29 = local_198 + 1;
    } while (ppSVar29 != local_1a0);
  }
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)
           foundImports.super_Storage._104_8_;
  if (foundImports._136_8_ != 0) {
    slang::detail::hashing::
    StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>
    ::deallocate((StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>,_96UL,_16UL>
                  *)&res,(pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::syntax::ModportSubroutinePortSyntax_*>
                          *)foundImports._136_8_,(foundImports._120_8_ * 0x178 + 0x186U) / 0x18);
  }
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
  ::delete_((allocator_type)waitingForImport.super_Storage._72_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_64UL,_16UL>_>
             *)&waitingForImport.field_0x50);
  return;
}

Assistant:

void Scope::handleExportedMethods(std::span<Symbol* const> deferredMembers) const {
    SmallSet<std::string_view, 4> waitingForImport;
    SmallMap<std::string_view, const ModportSubroutinePortSyntax*, 4> foundImports;

    auto create = [&](const ModportSubroutinePortSyntax& syntax) {
        auto& symbol = MethodPrototypeSymbol::implicitExtern(*this, syntax);
        insertMember(&symbol, nullptr, true, true);
    };

    for (auto symbol : deferredMembers) {
        auto& node = symbol->as<DeferredMemberSymbol>().node;
        if (node.kind != SyntaxKind::ModportDeclaration)
            continue;

        for (auto item : node.as<ModportDeclarationSyntax>().items) {
            for (auto port : item->ports->ports) {
                if (port->kind != SyntaxKind::ModportSubroutinePortList)
                    continue;

                auto& portList = port->as<ModportSubroutinePortListSyntax>();
                bool isExport = portList.importExport.kind == TokenKind::ExportKeyword;

                for (auto subPort : portList.ports) {
                    switch (subPort->kind) {
                        case SyntaxKind::ModportNamedPort: {
                            // A simple named export is not enough to create a
                            // new extern prototype, but if an import has already
                            // declared it for us then we can take details from that.
                            // Otherwise remember it in case we see an import for it later.
                            if (isExport) {
                                auto& mnps = subPort->as<ModportNamedPortSyntax>();
                                auto name = mnps.name.valueText();
                                if (name.empty() || nameMap->find(name) != nameMap->end())
                                    break;

                                if (auto it = foundImports.find(name); it != foundImports.end())
                                    create(*it->second);
                                else
                                    waitingForImport.emplace(name);
                            }
                            break;
                        }
                        case SyntaxKind::ModportSubroutinePort: {
                            // If this is an export, see if this should create an implicit
                            // extern prototype. If it's an import then see if a previous
                            // export is waiting for it to be declared.
                            auto& msps = subPort->as<ModportSubroutinePortSyntax>();
                            auto name = msps.prototype->name->getLastToken().valueText();
                            if (name.empty() || nameMap->find(name) != nameMap->end())
                                break;

                            if (isExport) {
                                create(msps);
                            }
                            else {
                                if (waitingForImport.find(name) != waitingForImport.end())
                                    create(msps);
                                else
                                    foundImports.emplace(name, &msps);
                            }
                            break;
                        }
                        default:
                            SLANG_UNREACHABLE;
                    }
                }
            }
        }
    }
}